

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

void __thiscall Dwell::Print(Dwell *this,ostream *out)

{
  ostream *this_00;
  void *this_01;
  ostream *out_local;
  Dwell *this_local;
  
  this_00 = std::operator<<(out,"Dwell: tf = ");
  this_01 = (void *)std::ostream::operator<<(this_00,(this->super_MotionBase).tf);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "Dwell: tf = " << tf << std::endl; }